

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

char * __thiscall cmsys::RegExpCompile::regpiece(RegExpCompile *this,int *flagp)

{
  RegExpCompile *pRVar1;
  char *pcVar2;
  char *val;
  undefined4 uVar3;
  uint local_3c;
  char *pcStack_38;
  int flags;
  char *next;
  RegExpCompile *pRStack_28;
  char op;
  char *ret;
  int *flagp_local;
  RegExpCompile *this_local;
  
  ret = (char *)flagp;
  flagp_local = (int *)this;
  pRStack_28 = (RegExpCompile *)regatom(this,(int *)&local_3c);
  if (pRStack_28 == (RegExpCompile *)0x0) {
    this_local = (RegExpCompile *)0x0;
  }
  else {
    next._7_1_ = *this->regparse;
    if (((next._7_1_ == '*') || (next._7_1_ == '+')) || (next._7_1_ == '?')) {
      if (((local_3c & 1) == 0) && (next._7_1_ != '?')) {
        printf("RegularExpression::compile() : *+ operand could be empty.\n");
        this_local = (RegExpCompile *)0x0;
      }
      else {
        uVar3 = 1;
        if (next._7_1_ != '+') {
          uVar3 = 4;
        }
        *(undefined4 *)ret = uVar3;
        if ((next._7_1_ == '*') && ((local_3c & 2) != 0)) {
          reginsert(this,'\n',(char *)pRStack_28);
        }
        else if (next._7_1_ == '*') {
          reginsert(this,'\x06',(char *)pRStack_28);
          pRVar1 = pRStack_28;
          pcVar2 = regnode(this,'\a');
          regoptail((char *)pRVar1,pcVar2);
          regoptail((char *)pRStack_28,(char *)pRStack_28);
          pRVar1 = pRStack_28;
          pcVar2 = regnode(this,'\x06');
          regtail((char *)pRVar1,pcVar2);
          pRVar1 = pRStack_28;
          pcVar2 = regnode(this,'\t');
          regtail((char *)pRVar1,pcVar2);
        }
        else if ((next._7_1_ == '+') && ((local_3c & 2) != 0)) {
          reginsert(this,'\v',(char *)pRStack_28);
        }
        else if (next._7_1_ == '+') {
          pcStack_38 = regnode(this,'\x06');
          regtail((char *)pRStack_28,pcStack_38);
          pcVar2 = regnode(this,'\a');
          regtail(pcVar2,(char *)pRStack_28);
          pcVar2 = pcStack_38;
          val = regnode(this,'\x06');
          regtail(pcVar2,val);
          pRVar1 = pRStack_28;
          pcVar2 = regnode(this,'\t');
          regtail((char *)pRVar1,pcVar2);
        }
        else if (next._7_1_ == '?') {
          reginsert(this,'\x06',(char *)pRStack_28);
          pRVar1 = pRStack_28;
          pcVar2 = regnode(this,'\x06');
          regtail((char *)pRVar1,pcVar2);
          pcStack_38 = regnode(this,'\t');
          regtail((char *)pRStack_28,pcStack_38);
          regoptail((char *)pRStack_28,pcStack_38);
        }
        this->regparse = this->regparse + 1;
        if (((*this->regparse == '*') || (*this->regparse == '+')) || (*this->regparse == '?')) {
          printf("RegularExpression::compile(): Nested *?+.\n");
          this_local = (RegExpCompile *)0x0;
        }
        else {
          this_local = pRStack_28;
        }
      }
    }
    else {
      *(uint *)ret = local_3c;
      this_local = pRStack_28;
    }
  }
  return (char *)this_local;
}

Assistant:

char* RegExpCompile::regpiece(int* flagp)
{
  char* ret;
  char op;
  char* next;
  int flags;

  ret = regatom(&flags);
  if (ret == KWSYS_NULLPTR)
    return (KWSYS_NULLPTR);

  op = *regparse;
  if (!ISMULT(op)) {
    *flagp = flags;
    return (ret);
  }

  if (!(flags & HASWIDTH) && op != '?') {
    // RAISE Error, SYM(RegularExpression), SYM(Empty_Operand),
    printf("RegularExpression::compile() : *+ operand could be empty.\n");
    return KWSYS_NULLPTR;
  }
  *flagp = (op != '+') ? (WORST | SPSTART) : (WORST | HASWIDTH);

  if (op == '*' && (flags & SIMPLE))
    reginsert(STAR, ret);
  else if (op == '*') {
    // Emit x* as (x&|), where & means "self".
    reginsert(BRANCH, ret);         // Either x
    regoptail(ret, regnode(BACK));  // and loop
    regoptail(ret, ret);            // back
    regtail(ret, regnode(BRANCH));  // or
    regtail(ret, regnode(NOTHING)); // null.
  } else if (op == '+' && (flags & SIMPLE))
    reginsert(PLUS, ret);
  else if (op == '+') {
    // Emit x+ as x(&|), where & means "self".
    next = regnode(BRANCH); // Either
    regtail(ret, next);
    regtail(regnode(BACK), ret);    // loop back
    regtail(next, regnode(BRANCH)); // or
    regtail(ret, regnode(NOTHING)); // null.
  } else if (op == '?') {
    // Emit x? as (x|)
    reginsert(BRANCH, ret);        // Either x
    regtail(ret, regnode(BRANCH)); // or
    next = regnode(NOTHING);       // null.
    regtail(ret, next);
    regoptail(ret, next);
  }
  regparse++;
  if (ISMULT(*regparse)) {
    // RAISE Error, SYM(RegularExpression), SYM(Nested_Operand),
    printf("RegularExpression::compile(): Nested *?+.\n");
    return KWSYS_NULLPTR;
  }
  return (ret);
}